

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitSubscriptSuffix(SyntaxDumper *this,SubscriptSuffixSyntax *node)

{
  SpecifierListSyntax *pSVar1;
  _func_int *p_Var2;
  SpecifierListSyntax **ppSVar3;
  SyntaxToken local_50;
  
  SubscriptSuffixSyntax::openBracketToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  ppSVar3 = &node->qualsAndAttrs1_;
  while (pSVar1 = *ppSVar3, pSVar1 != (SpecifierListSyntax *)0x0) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pSVar1->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    .value);
    ppSVar3 = &(pSVar1->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next;
  }
  SubscriptSuffixSyntax::staticKeyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  ppSVar3 = &node->qualsAndAttrs2_;
  while( true ) {
    pSVar1 = *ppSVar3;
    p_Var2 = (this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e];
    if (pSVar1 == (SpecifierListSyntax *)0x0) break;
    (*p_Var2)(this,(pSVar1->
                   super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   ).
                   super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .value);
    ppSVar3 = &(pSVar1->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next;
  }
  (*p_Var2)(this,node->expr_);
  SubscriptSuffixSyntax::asteriskToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  SubscriptSuffixSyntax::closeBracketToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitSubscriptSuffix(const SubscriptSuffixSyntax* node) override
    {
        terminal(node->openBracketToken(), node);
        for (auto iter = node->qualifiersAndAttributes(); iter; iter = iter->next)
            nonterminal(iter->value);
        terminal(node->staticKeyword(), node);
        for (auto iter = node->qualifiersAndAttributes_PostStatic(); iter; iter = iter->next)
            nonterminal(iter->value);
        nonterminal(node->expression());
        terminal(node->asteriskToken(), node);
        terminal(node->closeBracketToken(), node);
        return Action::Skip;
    }